

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

ma_result ma_gainer_process_pcm_frames
                    (ma_gainer *pGainer,void *pFramesOut,void *pFramesIn,ma_uint64 frameCount)

{
  uint uVar1;
  uint uVar2;
  float *pfVar3;
  float *pfVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  long lVar11;
  void *pvVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  void *pvVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float pRunningGainDelta [32];
  float local_138 [4];
  float local_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  float local_b8 [4];
  float fStack_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  float pRunningGain [32];
  
  if (pGainer == (ma_gainer *)0x0) {
    return MA_INVALID_ARGS;
  }
  uVar1 = (pGainer->config).smoothTimeInFrames;
  uVar13 = (ulong)uVar1;
  uVar10 = pGainer->t;
  uVar9 = (ulong)(uVar10 - uVar1);
  if (frameCount <= uVar10 - uVar1) {
    uVar9 = frameCount;
  }
  if (uVar9 == 0 || uVar1 <= uVar10) goto LAB_0015ead1;
  if (pFramesIn != (void *)0x0 && pFramesOut != (void *)0x0) {
    fVar17 = (float)uVar10 / (float)uVar13;
    fVar18 = 1.0 / (float)uVar13;
    uVar2 = (pGainer->config).channels;
    uVar8 = (ulong)uVar2;
    if (uVar8 < 0x21) {
      if (uVar8 == 0) {
LAB_0015e98a:
        uVar15 = 0;
      }
      else {
        pfVar3 = pGainer->pNewGains;
        pfVar4 = pGainer->pOldGains;
        fVar20 = pGainer->masterVolume;
        uVar15 = 0;
        do {
          fVar21 = pfVar4[uVar15];
          fVar19 = (pfVar3[uVar15] - fVar21) * fVar20;
          local_b8[uVar15] = fVar18 * fVar19;
          local_138[uVar15] = fVar21 * fVar20 + fVar19 * fVar17;
          uVar15 = uVar15 + 1;
        } while (uVar8 != uVar15);
        if (uVar8 == 8) {
          lVar11 = 0x10;
          uVar15 = 0;
          do {
            pfVar3 = (float *)((long)pFramesIn + lVar11 + -0x10);
            fVar17 = pfVar3[1];
            fVar18 = pfVar3[2];
            fVar20 = pfVar3[3];
            pfVar4 = (float *)((long)pFramesOut + lVar11 + -0x10);
            *pfVar4 = *pfVar3 * local_138[0];
            pfVar4[1] = fVar17 * local_138[1];
            pfVar4[2] = fVar18 * local_138[2];
            pfVar4[3] = fVar20 * local_138[3];
            pfVar3 = (float *)((long)pFramesIn + lVar11);
            fVar17 = pfVar3[1];
            fVar18 = pfVar3[2];
            fVar20 = pfVar3[3];
            pfVar4 = (float *)((long)pFramesOut + lVar11);
            *pfVar4 = *pfVar3 * local_128;
            pfVar4[1] = fVar17 * fStack_124;
            pfVar4[2] = fVar18 * fStack_120;
            pfVar4[3] = fVar20 * fStack_11c;
            local_138[0] = local_138[0] + local_b8[0];
            local_138[1] = local_138[1] + local_b8[1];
            local_138[2] = local_138[2] + local_b8[2];
            local_138[3] = local_138[3] + local_b8[3];
            local_128 = local_128 + fStack_a8;
            fStack_124 = fStack_124 + fStack_a4;
            fStack_120 = fStack_120 + fStack_a0;
            fStack_11c = fStack_11c + fStack_9c;
            uVar15 = uVar15 + 1;
            lVar11 = lVar11 + 0x20;
          } while (uVar9 != uVar15);
        }
        else {
          if (uVar2 == 6) {
            if (1 < uVar9) {
              lVar11 = 0;
              fVar20 = local_138[2];
              fVar21 = local_138[3];
              fVar19 = local_128;
              fVar22 = fStack_124;
              fVar17 = local_138[1];
              fVar18 = local_138[0];
              do {
                fVar18 = local_b8[0] + fVar18;
                fVar17 = local_b8[1] + fVar17;
                fVar20 = fVar20 + local_b8[2];
                fVar21 = fVar21 + local_b8[3];
                fVar19 = fVar19 + fStack_a8;
                fVar22 = fVar22 + fStack_a4;
                pfVar3 = (float *)((long)pFramesIn + lVar11);
                fVar5 = pfVar3[1];
                fVar6 = pfVar3[2];
                fVar7 = pfVar3[3];
                pfVar4 = (float *)((long)pFramesOut + lVar11);
                *pfVar4 = *pfVar3 * local_138[0];
                pfVar4[1] = fVar5 * local_138[1];
                pfVar4[2] = fVar6 * local_138[2];
                pfVar4[3] = fVar7 * local_138[3];
                pfVar3 = (float *)((long)pFramesIn + lVar11 + 0x10);
                fVar5 = pfVar3[1];
                fVar6 = pfVar3[2];
                fVar7 = pfVar3[3];
                pfVar4 = (float *)((long)pFramesOut + lVar11 + 0x10);
                *pfVar4 = *pfVar3 * local_128;
                pfVar4[1] = fVar5 * fStack_124;
                pfVar4[2] = fVar6 * fVar18;
                pfVar4[3] = fVar7 * fVar17;
                pfVar3 = (float *)((long)pFramesIn + lVar11 + 0x20);
                fVar5 = pfVar3[1];
                fVar6 = pfVar3[2];
                fVar7 = pfVar3[3];
                pfVar4 = (float *)((long)pFramesOut + lVar11 + 0x20);
                *pfVar4 = *pfVar3 * fVar20;
                pfVar4[1] = fVar5 * fVar21;
                pfVar4[2] = fVar6 * fVar19;
                pfVar4[3] = fVar7 * fVar22;
                local_138[0] = local_138[0] + local_b8[0];
                local_138[1] = local_138[1] + local_b8[1];
                local_138[2] = local_138[2] + local_b8[2];
                local_138[3] = local_138[3] + local_b8[3];
                local_128 = local_128 + fStack_a8;
                fStack_124 = fStack_124 + fStack_a4;
                lVar11 = lVar11 + 0x30;
              } while ((uVar9 >> 1) * 0x30 != lVar11);
            }
          }
          else {
            if (uVar2 != 2) goto LAB_0015e98a;
            if (1 < uVar9) {
              lVar11 = 0;
              fVar17 = local_138[0];
              fVar18 = local_138[1];
              do {
                local_138[1] = local_b8[1] + local_138[1];
                local_138[0] = local_b8[0] + local_138[0];
                pfVar3 = (float *)((long)pFramesIn + lVar11);
                fVar20 = pfVar3[1];
                fVar21 = pfVar3[2];
                fVar19 = pfVar3[3];
                pfVar4 = (float *)((long)pFramesOut + lVar11);
                *pfVar4 = *pfVar3 * fVar17;
                pfVar4[1] = fVar20 * fVar18;
                pfVar4[2] = fVar21 * local_138[0];
                pfVar4[3] = fVar19 * local_138[1];
                fVar17 = fVar17 + local_b8[0];
                fVar18 = fVar18 + local_b8[1];
                lVar11 = lVar11 + 0x10;
              } while ((uVar9 >> 1) * 0x10 != lVar11);
            }
          }
          uVar15 = (ulong)((uint)uVar9 & 0xfffffffe);
        }
      }
      if (uVar15 < uVar9) {
        pvVar12 = (void *)((long)pFramesOut + uVar15 * uVar8 * 4);
        pvVar16 = (void *)((long)pFramesIn + uVar15 * uVar8 * 4);
        do {
          if (uVar8 != 0) {
            uVar14 = 0;
            do {
              fVar17 = local_138[uVar14];
              *(float *)((long)pvVar12 + uVar14 * 4) =
                   *(float *)((long)pvVar16 + uVar14 * 4) * fVar17;
              local_138[uVar14] = fVar17 + local_b8[uVar14];
              uVar14 = uVar14 + 1;
            } while (uVar8 != uVar14);
          }
          uVar15 = uVar15 + 1;
          pvVar12 = (void *)((long)pvVar12 + uVar8 * 4);
          pvVar16 = (void *)((long)pvVar16 + uVar8 * 4);
        } while (uVar15 != uVar9);
      }
    }
    else {
      pfVar3 = pGainer->pOldGains;
      pfVar4 = pGainer->pNewGains;
      fVar20 = pGainer->masterVolume;
      uVar15 = 0;
      pvVar12 = pFramesIn;
      pvVar16 = pFramesOut;
      do {
        uVar14 = 0;
        do {
          *(float *)((long)pvVar16 + uVar14 * 4) =
               ((pfVar4[uVar14] - pfVar3[uVar14]) * fVar17 + pfVar3[uVar14]) *
               *(float *)((long)pvVar12 + uVar14 * 4) * fVar20;
          uVar14 = uVar14 + 1;
        } while (uVar8 != uVar14);
        fVar17 = fVar17 + fVar18;
        uVar15 = uVar15 + 1;
        pvVar16 = (void *)((long)pvVar16 + uVar8 * 4);
        pvVar12 = (void *)((long)pvVar12 + uVar8 * 4);
      } while (uVar15 != uVar9);
    }
  }
  uVar8 = uVar10 + uVar9;
  uVar10 = (uint)uVar8;
  if (uVar13 <= uVar8) {
    uVar10 = uVar1;
  }
  pGainer->t = uVar10;
  frameCount = frameCount - uVar9;
  pFramesOut = (void *)((long)pFramesOut + uVar9 * 4);
  pFramesIn = (void *)((long)pFramesIn + uVar9 * 4);
LAB_0015ead1:
  if (pFramesIn != (void *)0x0 && pFramesOut != (void *)0x0) {
    uVar9 = (ulong)(pGainer->config).channels;
    if (uVar9 < 0x21) {
      if (uVar9 != 0) {
        pfVar3 = pGainer->pNewGains;
        fVar17 = pGainer->masterVolume;
        uVar8 = 0;
        do {
          local_138[uVar8] = pfVar3[uVar8] * fVar17;
          uVar8 = uVar8 + 1;
        } while (uVar9 != uVar8);
      }
      if (frameCount != 0) {
        uVar8 = 0;
        do {
          if (uVar9 != 0) {
            uVar15 = 0;
            do {
              *(float *)((long)pFramesOut + uVar15 * 4) =
                   *(float *)((long)pFramesIn + uVar15 * 4) * local_138[uVar15];
              uVar15 = uVar15 + 1;
            } while (uVar9 != uVar15);
          }
          uVar8 = uVar8 + 1;
          pFramesOut = (void *)((long)pFramesOut + uVar9 * 4);
          pFramesIn = (void *)((long)pFramesIn + uVar9 * 4);
        } while (uVar8 != frameCount);
      }
    }
    else if (frameCount != 0) {
      pfVar3 = pGainer->pNewGains;
      fVar17 = pGainer->masterVolume;
      uVar8 = 0;
      do {
        uVar15 = 0;
        do {
          *(float *)((long)pFramesOut + uVar15 * 4) =
               *(float *)((long)pFramesIn + uVar15 * 4) * pfVar3[uVar15] * fVar17;
          uVar15 = uVar15 + 1;
        } while (uVar9 != uVar15);
        uVar8 = uVar8 + 1;
        pFramesOut = (void *)((long)pFramesOut + uVar9 * 4);
        pFramesIn = (void *)((long)pFramesIn + uVar9 * 4);
      } while (uVar8 != frameCount);
    }
  }
  if (pGainer->t == 0xffffffff) {
    uVar10 = (uint)frameCount;
    if (uVar13 < frameCount) {
      uVar10 = uVar1;
    }
    pGainer->t = uVar10;
    return MA_SUCCESS;
  }
  return MA_SUCCESS;
}

Assistant:

MA_API ma_result ma_gainer_process_pcm_frames(ma_gainer* pGainer, void* pFramesOut, const void* pFramesIn, ma_uint64 frameCount)
{
    if (pGainer == NULL) {
        return MA_INVALID_ARGS;
    }

    /*
    ma_gainer_process_pcm_frames_internal() marks pFramesOut and pFramesIn with MA_RESTRICT which
    helps with auto-vectorization.
    */
    return ma_gainer_process_pcm_frames_internal(pGainer, pFramesOut, pFramesIn, frameCount);
}